

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

void __thiscall
pybind11::detail::values_and_holders::values_and_holders(values_and_holders *this,PyObject *obj)

{
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *pvVar1;
  
  this->inst = (instance *)0x0;
  pvVar1 = all_type_info(obj->ob_type);
  this->tinfo = pvVar1;
  if ((pvVar1->
      super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    this->inst = (instance *)obj;
  }
  return;
}

Assistant:

explicit values_and_holders(PyObject *obj)
        : inst{nullptr}, tinfo(all_type_info(Py_TYPE(obj))) {
        if (!tinfo.empty()) {
            inst = reinterpret_cast<instance *>(obj);
        }
    }